

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

mz_bool mz_zip_writer_add_mem_ex
                  (mz_zip_archive *pZip,char *pArchive_name,void *pBuf,size_t buf_size,
                  void *pComment,mz_uint16 comment_size,mz_uint level_and_flags,
                  mz_uint64 uncomp_size,mz_uint32 uncomp_crc32)

{
  mz_bool mVar1;
  
  mVar1 = mz_zip_writer_add_mem_ex_v2
                    (pZip,pArchive_name,pBuf,buf_size,pComment,comment_size,level_and_flags,
                     uncomp_size,uncomp_crc32,(time_t *)0x0,(char *)0x0,0,(char *)0x0,0);
  return mVar1;
}

Assistant:

inline mz_bool mz_zip_writer_add_mem_ex(mz_zip_archive* pZip,
                                        const char* pArchive_name,
                                        const void* pBuf,
                                        size_t buf_size,
                                        const void* pComment,
                                        mz_uint16 comment_size,
                                        mz_uint level_and_flags,
                                        mz_uint64 uncomp_size,
                                        mz_uint32 uncomp_crc32) {

    return mz_zip_writer_add_mem_ex_v2(pZip,
                                       pArchive_name,
                                       pBuf,
                                       buf_size,
                                       pComment,
                                       comment_size,
                                       level_and_flags,
                                       uncomp_size,
                                       uncomp_crc32,
                                       NULL,
                                       NULL,
                                       0,
                                       NULL,
                                       0);
}